

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O3

void __thiscall
amrex::MLEBTensorOp::compVelGrad
          (MLEBTensorOp *this,int amrlev,Array<MultiFab_*,_3> *fluxes,MultiFab *sol,Location loc)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  FabType FVar39;
  int iVar40;
  long lVar41;
  FabArray<amrex::EBCellFlagFab> *pFVar42;
  int *piVar43;
  DataAllocator DVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  BaseFab<double> *this_00;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  Real dzi;
  Real dxi;
  Real dyi;
  Array4<const_double> vfab;
  Box zbx;
  Box ybx;
  Box xbx;
  Array<FArrayBox,_3> fluxfab_tmp;
  MFIter mfi;
  Array4<double> dst;
  Elixir fzeli;
  Elixir fyeli;
  Elixir fxeli;
  long local_5c0;
  long local_5b0;
  long local_5a8;
  long local_598;
  long local_590;
  long local_588;
  long local_4f0;
  long local_4e8;
  long local_4e0;
  long local_4d8;
  double *local_3b0;
  Array4<const_double> local_370;
  MFItInfo local_32c;
  Box local_318;
  Box local_2fc;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  FabArray<amrex::EBCellFlagFab> *local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  ulong local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  Array<MultiFab_*,_3> *local_250;
  Box local_248;
  Box local_22c;
  BaseFab<double> local_210;
  FArrayBox local_1c8;
  FArrayBox local_180;
  MFIter local_138;
  Array4<double> local_d8;
  Elixir local_98;
  Elixir local_80;
  Elixir local_68;
  Box local_4c;
  
  local_250 = fluxes;
  if (FaceCentroid < loc) {
    Abort_host("MLEBTensorOp::compVelGrad() unknown location for VelGradients.");
  }
  pFVar42 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  applyBCTensor(this,amrlev,0,sol,Inhomogeneous,Solution,
                (MLMGBndry *)
                (this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.m_bndry_sol.
                super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                .
                super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
                super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>);
  lVar41 = **(long **)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp
                       .m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[amrlev].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  if (lVar41 != 0) {
    pFVar42 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    lVar41 = __dynamic_cast(lVar41,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
    if (lVar41 != 0) {
      pFVar42 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar41 + 0xd8));
    }
  }
  lVar41 = *(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                     m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  dVar3 = *(double *)(lVar41 + 0x38);
  dVar4 = *(double *)(lVar41 + 0x40);
  dVar5 = *(double *)(lVar41 + 0x48);
  local_32c.num_streams = Gpu::Device::max_gpu_streams;
  local_32c.do_tiling = true;
  local_32c.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_32c.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_32c.tilesize.vect[2] = DAT_00810ec0;
  local_32c.dynamic = true;
  local_32c.device_sync = true;
  lVar41 = 0;
  do {
    FArrayBox::FArrayBox((FArrayBox *)((long)(&local_210.domain.smallend + -2) + lVar41));
    lVar41 = lVar41 + 0x48;
  } while (lVar41 != 0xd8);
  MFIter::MFIter(&local_138,(FabArrayBase *)sol,&local_32c);
  if (local_138.currentIndex < local_138.endIndex) {
    local_2d8 = dVar4 * 0.25;
    local_2e0 = dVar5 * 0.25;
    local_2d0 = dVar3 * 0.25;
    local_2c8 = pFVar42;
    do {
      MFIter::tilebox(&local_4c,&local_138);
      if (pFVar42 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
LAB_00701561:
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_370,&sol->super_FabArray<amrex::FArrayBox>,&local_138);
        MFIter::nodaltilebox(&local_22c,&local_138,0);
        MFIter::nodaltilebox(&local_2fc,&local_138,1);
        MFIter::nodaltilebox(&local_318,&local_138,2);
        FArrayBox::resize((FArrayBox *)&local_210,&local_22c,9,(Arena *)0x0);
        FArrayBox::resize(&local_1c8,&local_2fc,9,(Arena *)0x0);
        FArrayBox::resize(&local_180,&local_318,9,(Arena *)0x0);
        DVar44.m_arena = local_210.super_DataAllocator.m_arena;
        if (local_210.super_DataAllocator.m_arena == (Arena *)0x0) {
          DVar44.m_arena = The_Arena();
        }
        Gpu::Elixir::Elixir(&local_68,(void *)0x0,DVar44.m_arena);
        DVar44.m_arena = local_1c8.super_BaseFab<double>.super_DataAllocator.m_arena;
        if (local_1c8.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
          DVar44.m_arena = The_Arena();
        }
        Gpu::Elixir::Elixir(&local_80,(void *)0x0,DVar44.m_arena);
        DVar44.m_arena = local_180.super_BaseFab<double>.super_DataAllocator.m_arena;
        if (local_180.super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
          DVar44.m_arena = The_Arena();
        }
        Gpu::Elixir::Elixir(&local_98,(void *)0x0,DVar44.m_arena);
        local_2c0 = (long)local_1c8.super_BaseFab<double>.domain.smallend.vect[0];
        local_2b8 = (long)local_1c8.super_BaseFab<double>.domain.smallend.vect[1];
        lVar41 = (long)local_1c8.super_BaseFab<double>.domain.smallend.vect[2];
        local_2b0 = (long)local_180.super_BaseFab<double>.domain.smallend.vect[0];
        local_2a0 = (long)local_180.super_BaseFab<double>.domain.smallend.vect[1];
        local_2a8 = (long)local_180.super_BaseFab<double>.domain.smallend.vect[2];
        lVar66 = (long)local_22c.smallend.vect[2];
        if (local_22c.smallend.vect[2] <= local_22c.bigend.vect[2]) {
          lVar60 = (long)local_210.domain.smallend.vect[2];
          lVar62 = (long)((local_210.domain.bigend.vect[2] - local_210.domain.smallend.vect[2]) + 1)
          ;
          lVar69 = (long)local_22c.smallend.vect[0] * 8;
          lVar70 = lVar69 + (long)local_210.domain.smallend.vect[0] * -8;
          local_260 = lVar62 * 8 + lVar60 * -8;
          local_270 = lVar62 * 0x20 + lVar60 * -8;
          local_258 = lVar62 * 0x28 + lVar60 * -8;
          local_268 = lVar62 * 0x10 + lVar60 * -8;
          local_278 = lVar62 * 0x30 + lVar60 * -8;
          local_280 = lVar62 * 0x38 + lVar60 * -8;
          lVar45 = (long)((local_210.domain.bigend.vect[0] - local_210.domain.smallend.vect[0]) + 1)
          ;
          local_288 = (long)((local_210.domain.bigend.vect[1] - local_210.domain.smallend.vect[1]) +
                            1);
          lVar57 = (long)local_210.domain.smallend.vect[1] * -8;
          local_290 = (ulong)(uint)local_22c.bigend.vect[1];
          local_298 = local_288 * 8;
          do {
            iVar40 = (int)lVar66;
            if (local_22c.smallend.vect[1] <= local_22c.bigend.vect[1]) {
              lVar46 = (long)local_370.begin.x;
              lVar73 = local_370.kstride * (lVar66 - local_370.begin.z);
              lVar51 = (long)((iVar40 + 1) - local_370.begin.z);
              lVar63 = local_370.kstride * 8;
              lVar55 = (~local_370.begin.z + iVar40) * lVar63;
              lVar56 = local_370.nstride * 0x10;
              lVar71 = lVar51 * lVar63;
              lVar63 = lVar63 * (lVar66 - local_370.begin.z);
              lVar75 = lVar56 + lVar63 + lVar46 * -8 + lVar69;
              lVar67 = lVar63 + local_370.nstride * 8 + lVar46 * -8 + lVar69;
              lVar77 = lVar63 + lVar46 * -8 + lVar69;
              lVar63 = local_370.jstride * 8;
              lVar53 = (long)local_22c.smallend.vect[1];
              do {
                iVar50 = (int)lVar53;
                if (local_22c.smallend.vect[0] <= local_22c.bigend.vect[0]) {
                  lVar58 = local_370.jstride * (lVar53 - local_370.begin.y);
                  lVar47 = (long)((iVar50 + 1) - local_370.begin.y);
                  lVar61 = (lVar53 - local_370.begin.y) * lVar63;
                  lVar52 = lVar47 * lVar63;
                  lVar64 = (~local_370.begin.y + iVar50) * lVar63;
                  lVar59 = 0;
                  do {
                    lVar68 = (long)(((local_22c.smallend.vect[0] + -1) - local_370.begin.x) +
                                   (int)lVar59);
                    pdVar2 = local_370.p + lVar58 + lVar68 + lVar73;
                    dVar8 = *(double *)((long)local_370.p + lVar59 * 8 + lVar61 + lVar67);
                    dVar9 = pdVar2[local_370.nstride];
                    dVar10 = *(double *)((long)local_370.p + lVar59 * 8 + lVar61 + lVar75);
                    dVar11 = pdVar2[local_370.nstride * 2];
                    dVar12 = *(double *)((long)local_370.p + lVar59 * 8 + lVar52 + lVar77);
                    pdVar1 = local_370.p + lVar73 + local_370.jstride * lVar47 + lVar68;
                    dVar13 = *pdVar1;
                    dVar14 = *(double *)((long)local_370.p + lVar59 * 8 + lVar52 + lVar67);
                    dVar15 = pdVar1[local_370.nstride];
                    dVar16 = *(double *)((long)local_370.p + lVar59 * 8 + lVar52 + lVar75);
                    dVar17 = pdVar1[local_370.nstride * 2];
                    dVar18 = *(double *)((long)local_370.p + lVar59 * 8 + lVar64 + lVar77);
                    pdVar1 = local_370.p +
                             lVar73 + local_370.jstride * (~local_370.begin.y + iVar50) + lVar68;
                    dVar19 = *pdVar1;
                    dVar20 = *(double *)((long)local_370.p + lVar59 * 8 + lVar64 + lVar67);
                    dVar21 = pdVar1[local_370.nstride];
                    dVar22 = *(double *)((long)local_370.p + lVar59 * 8 + lVar64 + lVar75);
                    dVar23 = pdVar1[local_370.nstride * 2];
                    dVar24 = *(double *)
                              ((long)local_370.p +
                              lVar59 * 8 + lVar61 + lVar71 + lVar46 * -8 + lVar69);
                    pdVar1 = local_370.p + lVar58 + lVar68 + local_370.kstride * lVar51;
                    dVar25 = *pdVar1;
                    dVar26 = *(double *)
                              ((long)local_370.p +
                              lVar59 * 8 +
                              lVar61 + lVar71 + local_370.nstride * 8 + lVar46 * -8 + lVar69);
                    dVar27 = pdVar1[local_370.nstride];
                    dVar28 = *(double *)
                              ((long)local_370.p +
                              lVar59 * 8 + lVar61 + lVar71 + lVar56 + lVar46 * -8 + lVar69);
                    dVar29 = pdVar1[local_370.nstride * 2];
                    dVar30 = *(double *)
                              ((long)local_370.p +
                              lVar59 * 8 + lVar61 + lVar55 + lVar46 * -8 + lVar69);
                    pdVar1 = local_370.p +
                             lVar58 + lVar68 + local_370.kstride * (~local_370.begin.z + iVar40);
                    dVar31 = *pdVar1;
                    dVar32 = *(double *)
                              ((long)local_370.p +
                              lVar59 * 8 +
                              lVar61 + lVar55 + local_370.nstride * 8 + lVar46 * -8 + lVar69);
                    dVar33 = pdVar1[local_370.nstride];
                    dVar6 = *(double *)
                             ((long)local_370.p +
                             lVar59 * 8 + lVar61 + lVar55 + lVar56 + lVar46 * -8 + lVar69);
                    dVar7 = pdVar1[local_370.nstride * 2];
                    *(double *)
                     ((long)local_210.dptr +
                     lVar59 * 8 +
                     ((lVar66 - lVar60) * local_298 + lVar57 + lVar53 * 8) * lVar45 + lVar70) =
                         (*(double *)((long)local_370.p + lVar59 * 8 + lVar61 + lVar77) - *pdVar2) *
                         dVar3;
                    *(double *)
                     ((long)local_210.dptr +
                     lVar59 * 8 +
                     ((local_260 + lVar66 * 8) * local_288 + lVar57 + lVar53 * 8) * lVar45 + lVar70)
                         = (dVar8 - dVar9) * dVar3;
                    *(double *)
                     ((long)local_210.dptr +
                     lVar59 * 8 +
                     ((local_268 + lVar66 * 8) * local_288 + lVar57 + lVar53 * 8) * lVar45 + lVar70)
                         = (dVar10 - dVar11) * dVar3;
                    *(double *)
                     ((long)local_210.dptr +
                     lVar59 * 8 +
                     ((lVar62 * 0x18 + lVar60 * -8 + lVar66 * 8) * local_288 + lVar57 + lVar53 * 8)
                     * lVar45 + lVar70) = (((dVar12 + dVar13) - dVar18) - dVar19) * local_2d8;
                    *(double *)
                     ((long)local_210.dptr +
                     lVar59 * 8 +
                     ((local_270 + lVar66 * 8) * local_288 + lVar57 + lVar53 * 8) * lVar45 + lVar70)
                         = (((dVar14 + dVar15) - dVar20) - dVar21) * local_2d8;
                    *(double *)
                     ((long)local_210.dptr +
                     lVar59 * 8 +
                     ((local_258 + lVar66 * 8) * local_288 + lVar57 + lVar53 * 8) * lVar45 + lVar70)
                         = (((dVar16 + dVar17) - dVar22) - dVar23) * local_2d8;
                    *(double *)
                     ((long)local_210.dptr +
                     lVar59 * 8 +
                     ((local_278 + lVar66 * 8) * local_288 + lVar57 + lVar53 * 8) * lVar45 + lVar70)
                         = (((dVar24 + dVar25) - dVar30) - dVar31) * local_2e0;
                    *(double *)
                     ((long)local_210.dptr +
                     lVar59 * 8 +
                     ((local_280 + lVar66 * 8) * local_288 + lVar57 + lVar53 * 8) * lVar45 + lVar70)
                         = (((dVar26 + dVar27) - dVar32) - dVar33) * local_2e0;
                    *(double *)
                     ((long)local_210.dptr +
                     lVar59 * 8 +
                     ((lVar62 * 0x40 + lVar60 * -8 + lVar66 * 8) * local_288 + lVar57 + lVar53 * 8)
                     * lVar45 + lVar70) = (((dVar28 + dVar29) - dVar6) - dVar7) * local_2e0;
                    lVar59 = lVar59 + 1;
                  } while ((local_22c.bigend.vect[0] - local_22c.smallend.vect[0]) + 1 !=
                           (int)lVar59);
                }
                lVar53 = lVar53 + 1;
              } while (iVar50 + 1 != local_22c.bigend.vect[1] + 1U);
            }
            lVar66 = lVar66 + 1;
          } while (iVar40 + 1 != local_22c.bigend.vect[2] + 1);
        }
        lVar66 = (long)local_2fc.smallend.vect[2];
        if (local_2fc.smallend.vect[2] <= local_2fc.bigend.vect[2]) {
          lVar69 = (long)((local_1c8.super_BaseFab<double>.domain.bigend.vect[0] -
                          local_1c8.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
          lVar70 = (long)((local_1c8.super_BaseFab<double>.domain.bigend.vect[1] -
                          local_1c8.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
          lVar63 = (long)((local_1c8.super_BaseFab<double>.domain.bigend.vect[2] -
                          local_1c8.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
          lVar75 = (long)local_2fc.smallend.vect[1];
          lVar57 = (long)local_2fc.smallend.vect[0] * 8;
          lVar60 = lVar57 + local_2c0 * -8;
          lVar62 = lVar75 * 8 + local_2b8 * -8;
          lVar45 = lVar69 * 8;
          do {
            iVar40 = (int)lVar66;
            if (local_2fc.smallend.vect[1] <= local_2fc.bigend.vect[1]) {
              lVar51 = (long)local_370.begin.x;
              lVar55 = local_370.kstride * (lVar66 - local_370.begin.z);
              lVar77 = local_370.jstride * 8;
              lVar73 = (lVar75 - local_370.begin.y) * lVar77;
              lVar52 = local_370.kstride * 8;
              lVar46 = (~local_370.begin.z + iVar40) * lVar52;
              lVar67 = lVar73 + lVar46;
              lVar58 = local_370.nstride * 0x10;
              lVar64 = ((iVar40 + 1) - local_370.begin.z) * lVar52;
              lVar52 = lVar52 * (lVar66 - local_370.begin.z);
              lVar71 = lVar64 + lVar73;
              lVar73 = lVar73 + lVar52;
              lVar53 = (long)local_370.p + lVar58 + lVar67 + lVar51 * -8 + lVar57;
              local_588 = (long)local_370.p + local_370.nstride * 8 + lVar67 + lVar51 * -8 + lVar57;
              lVar76 = (long)local_370.p + lVar67 + lVar51 * -8 + lVar57;
              local_590 = (long)local_370.p + lVar71 + lVar58 + lVar51 * -8 + lVar57;
              lVar61 = (long)local_370.p + lVar71 + local_370.nstride * 8 + lVar51 * -8 + lVar57;
              lVar68 = (long)local_370.p + lVar71 + lVar51 * -8 + lVar57;
              local_4f0 = (long)local_370.p + lVar73 + lVar58 + lVar51 * -8 + lVar57 + 8;
              lVar47 = (long)local_370.p + lVar73 + local_370.nstride * 8 + lVar51 * -8 + lVar57 + 8
              ;
              lVar74 = (long)local_370.p + lVar73 + lVar51 * -8 + lVar57 + 8;
              iVar50 = (local_2fc.smallend.vect[1] + -1) - local_370.begin.y;
              local_598 = (long)local_1c8.super_BaseFab<double>.dptr +
                          ((lVar66 - lVar41) * lVar70 * 8 + lVar62) * lVar69 + lVar60;
              local_4d8 = (long)local_1c8.super_BaseFab<double>.dptr +
                          ((lVar63 * 8 + lVar41 * -8 + lVar66 * 8) * lVar70 + lVar62) * lVar69 +
                          lVar60;
              local_4e0 = (long)local_1c8.super_BaseFab<double>.dptr +
                          ((lVar63 * 0x10 + lVar41 * -8 + lVar66 * 8) * lVar70 + lVar62) * lVar69 +
                          lVar60;
              local_4e8 = (long)local_1c8.super_BaseFab<double>.dptr +
                          ((lVar63 * 0x18 + lVar41 * -8 + lVar66 * 8) * lVar70 + lVar62) * lVar69 +
                          lVar60;
              lVar73 = (long)local_1c8.super_BaseFab<double>.dptr +
                       ((lVar63 * 0x20 + lVar41 * -8 + lVar66 * 8) * lVar70 + lVar62) * lVar69 +
                       lVar60;
              lVar59 = (long)local_1c8.super_BaseFab<double>.dptr +
                       ((lVar63 * 0x28 + lVar41 * -8 + lVar66 * 8) * lVar70 + lVar62) * lVar69 +
                       lVar60;
              lVar56 = (long)local_1c8.super_BaseFab<double>.dptr +
                       ((lVar63 * 0x30 + lVar41 * -8 + lVar66 * 8) * lVar70 + lVar62) * lVar69 +
                       lVar60;
              lVar71 = (long)local_1c8.super_BaseFab<double>.dptr +
                       ((lVar63 * 0x38 + lVar41 * -8 + lVar66 * 8) * lVar70 + lVar62) * lVar69 +
                       lVar60;
              lVar67 = (long)local_1c8.super_BaseFab<double>.dptr +
                       ((lVar63 * 0x40 + lVar41 * -8 + lVar66 * 8) * lVar70 + lVar62) * lVar69 +
                       lVar60;
              local_5a8 = lVar75;
              do {
                if (local_2fc.smallend.vect[0] <= local_2fc.bigend.vect[0]) {
                  lVar78 = iVar50 * lVar77;
                  lVar36 = lVar78 + lVar58 + lVar52 + lVar51 * -8 + lVar57;
                  lVar37 = lVar78 + lVar52 + local_370.nstride * 8 + lVar51 * -8 + lVar57;
                  lVar38 = lVar78 + lVar52 + lVar51 * -8 + lVar57;
                  lVar48 = 0;
                  do {
                    lVar54 = (long)(((local_2fc.smallend.vect[0] + -1) - local_370.begin.x) +
                                   (int)lVar48);
                    pdVar1 = local_370.p +
                             (local_5a8 - local_370.begin.y) * local_370.jstride + lVar55 + lVar54;
                    dVar8 = *(double *)(lVar47 + lVar48 * 8);
                    dVar9 = *(double *)((long)local_370.p + lVar48 * 8 + lVar37 + 8);
                    dVar10 = pdVar1[local_370.nstride];
                    dVar11 = *(double *)(local_4f0 + lVar48 * 8);
                    dVar12 = *(double *)((long)local_370.p + lVar48 * 8 + lVar36 + 8);
                    dVar13 = pdVar1[local_370.nstride * 2];
                    pdVar2 = local_370.p +
                             (~local_370.begin.y + (int)local_5a8) * local_370.jstride +
                             lVar55 + lVar54;
                    dVar14 = pdVar2[local_370.nstride];
                    dVar15 = pdVar2[local_370.nstride * 2];
                    dVar16 = *(double *)(lVar74 + -8 + lVar48 * 8);
                    dVar17 = *(double *)(lVar47 + -8 + lVar48 * 8);
                    dVar18 = *(double *)(local_4f0 + -8 + lVar48 * 8);
                    dVar19 = *(double *)((long)local_370.p + lVar48 * 8 + lVar38);
                    dVar20 = *(double *)((long)local_370.p + lVar48 * 8 + lVar37);
                    dVar21 = *(double *)((long)local_370.p + lVar48 * 8 + lVar36);
                    dVar22 = *(double *)(lVar68 + lVar48 * 8);
                    dVar23 = *(double *)
                              ((long)local_370.p +
                              lVar48 * 8 + lVar78 + lVar64 + lVar51 * -8 + lVar57);
                    dVar24 = *(double *)(lVar76 + lVar48 * 8);
                    dVar25 = *(double *)
                              ((long)local_370.p +
                              lVar48 * 8 + lVar78 + lVar46 + lVar51 * -8 + lVar57);
                    dVar26 = *(double *)(lVar61 + lVar48 * 8);
                    dVar27 = *(double *)
                              ((long)local_370.p +
                              lVar48 * 8 +
                              lVar78 + lVar64 + local_370.nstride * 8 + lVar51 * -8 + lVar57);
                    dVar28 = *(double *)(local_588 + lVar48 * 8);
                    dVar29 = *(double *)
                              ((long)local_370.p +
                              lVar48 * 8 +
                              lVar78 + lVar46 + local_370.nstride * 8 + lVar51 * -8 + lVar57);
                    dVar30 = *(double *)(local_590 + lVar48 * 8);
                    dVar31 = *(double *)
                              ((long)local_370.p +
                              lVar48 * 8 + lVar78 + lVar64 + lVar58 + lVar51 * -8 + lVar57);
                    dVar32 = *(double *)(lVar53 + lVar48 * 8);
                    dVar33 = *(double *)
                              ((long)local_370.p +
                              lVar48 * 8 + lVar78 + lVar46 + lVar58 + lVar51 * -8 + lVar57);
                    *(double *)(local_598 + lVar48 * 8) =
                         (((*(double *)(lVar74 + lVar48 * 8) +
                           *(double *)((long)local_370.p + lVar48 * 8 + lVar38 + 8)) - *pdVar1) -
                         *pdVar2) * local_2d0;
                    *(double *)(local_4d8 + lVar48 * 8) =
                         (((dVar8 + dVar9) - dVar10) - dVar14) * local_2d0;
                    *(double *)(local_4e0 + lVar48 * 8) =
                         (((dVar11 + dVar12) - dVar13) - dVar15) * local_2d0;
                    *(double *)(local_4e8 + lVar48 * 8) = (dVar16 - dVar19) * dVar4;
                    *(double *)(lVar73 + lVar48 * 8) = (dVar17 - dVar20) * dVar4;
                    *(double *)(lVar59 + lVar48 * 8) = (dVar18 - dVar21) * dVar4;
                    *(double *)(lVar56 + lVar48 * 8) =
                         (((dVar22 + dVar23) - dVar24) - dVar25) * local_2e0;
                    *(double *)(lVar71 + lVar48 * 8) =
                         (((dVar26 + dVar27) - dVar28) - dVar29) * local_2e0;
                    *(double *)(lVar67 + lVar48 * 8) =
                         (((dVar30 + dVar31) - dVar32) - dVar33) * local_2e0;
                    lVar48 = lVar48 + 1;
                  } while ((local_2fc.bigend.vect[0] - local_2fc.smallend.vect[0]) + 1 !=
                           (int)lVar48);
                }
                local_5a8 = local_5a8 + 1;
                lVar53 = lVar53 + lVar77;
                local_588 = local_588 + lVar77;
                lVar76 = lVar76 + lVar77;
                local_590 = local_590 + lVar77;
                lVar61 = lVar61 + lVar77;
                lVar68 = lVar68 + lVar77;
                local_4f0 = local_4f0 + lVar77;
                lVar47 = lVar47 + lVar77;
                lVar74 = lVar74 + lVar77;
                iVar50 = iVar50 + 1;
                local_598 = local_598 + lVar45;
                local_4d8 = local_4d8 + lVar45;
                local_4e0 = local_4e0 + lVar45;
                local_4e8 = local_4e8 + lVar45;
                lVar73 = lVar73 + lVar45;
                lVar59 = lVar59 + lVar45;
                lVar56 = lVar56 + lVar45;
                lVar71 = lVar71 + lVar45;
                lVar67 = lVar67 + lVar45;
              } while (local_2fc.bigend.vect[1] + 1 != (int)local_5a8);
            }
            lVar66 = lVar66 + 1;
          } while (iVar40 + 1 != local_2fc.bigend.vect[2] + 1);
        }
        local_5b0 = (long)local_318.smallend.vect[2];
        if (local_318.smallend.vect[2] <= local_318.bigend.vect[2]) {
          lVar75 = (long)((local_180.super_BaseFab<double>.domain.bigend.vect[0] -
                          local_180.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
          lVar67 = (long)((local_180.super_BaseFab<double>.domain.bigend.vect[1] -
                          local_180.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
          lVar70 = (long)((local_180.super_BaseFab<double>.domain.bigend.vect[2] -
                          local_180.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
          lVar63 = (long)local_318.smallend.vect[0] * 8;
          local_3b0 = local_180.super_BaseFab<double>.dptr +
                      (local_318.smallend.vect[0] - local_2b0);
          lVar77 = local_5b0 - local_2a8;
          lVar69 = local_5b0 * 8;
          lVar41 = local_5b0 * 8;
          lVar66 = local_5b0 * 8;
          lVar45 = local_5b0 * 8;
          lVar57 = local_5b0 * 8;
          lVar60 = local_5b0 * 8;
          lVar62 = local_5b0 * 8;
          iVar40 = local_318.smallend.vect[2] + -1;
          do {
            if (local_318.smallend.vect[1] <= local_318.bigend.vect[1]) {
              lVar53 = (long)local_370.begin.x;
              lVar59 = (long)(iVar40 - local_370.begin.z) * local_370.kstride * 8;
              lVar64 = lVar59 + local_370.nstride * 0x10 + lVar53 * -8;
              lVar46 = lVar64 + lVar63;
              lVar68 = lVar59 + local_370.nstride * 8 + lVar53 * -8;
              lVar51 = lVar68 + lVar63;
              lVar59 = lVar59 + lVar53 * -8;
              lVar47 = local_370.kstride * 8 * (local_5b0 - local_370.begin.z);
              lVar61 = local_370.nstride * 0x10 + lVar47 + lVar53 * -8;
              lVar52 = lVar47 + local_370.nstride * 8 + lVar53 * -8;
              lVar47 = lVar47 + lVar53 * -8;
              lVar71 = lVar59 + lVar63;
              lVar73 = lVar61 + lVar63;
              lVar55 = lVar52 + lVar63;
              lVar56 = lVar47 + lVar63;
              lVar53 = local_370.jstride * 8;
              lVar58 = (long)local_318.smallend.vect[1];
              do {
                iVar50 = (int)lVar58;
                if (local_318.smallend.vect[0] <= local_318.bigend.vect[0]) {
                  lVar48 = local_370.jstride * (lVar58 - local_370.begin.y);
                  lVar54 = ((iVar50 + 1) - local_370.begin.y) * lVar53;
                  lVar72 = (~local_370.begin.y + iVar50) * lVar53;
                  lVar78 = (lVar58 - local_370.begin.y) * lVar53;
                  lVar74 = lVar78 + lVar64 + lVar63 + 8;
                  lVar76 = lVar78 + lVar68 + 8 + lVar63;
                  lVar36 = lVar78 + lVar59 + 8 + lVar63;
                  lVar37 = lVar78 + lVar61 + 8 + lVar63;
                  lVar38 = lVar78 + lVar52 + 8 + lVar63;
                  lVar78 = lVar78 + lVar47 + 8 + lVar63;
                  lVar65 = 0;
                  do {
                    lVar49 = (long)(((local_318.smallend.vect[0] + -1) - local_370.begin.x) +
                                   (int)lVar65);
                    pdVar1 = local_370.p +
                             lVar48 + lVar49 + local_370.kstride * (local_5b0 - local_370.begin.z);
                    dVar8 = *(double *)((long)local_370.p + lVar65 * 8 + lVar38);
                    dVar9 = *(double *)((long)local_370.p + lVar65 * 8 + lVar76);
                    dVar10 = pdVar1[local_370.nstride];
                    dVar11 = *(double *)((long)local_370.p + lVar65 * 8 + lVar37);
                    dVar12 = *(double *)((long)local_370.p + lVar65 * 8 + lVar74);
                    dVar13 = pdVar1[local_370.nstride * 2];
                    pdVar2 = local_370.p +
                             lVar48 + lVar49 + (~local_370.begin.z + (int)local_5b0) *
                                               local_370.kstride;
                    dVar14 = pdVar2[local_370.nstride];
                    dVar15 = pdVar2[local_370.nstride * 2];
                    dVar16 = *(double *)((long)local_370.p + lVar65 * 8 + lVar78 + -8);
                    dVar17 = *(double *)((long)local_370.p + lVar65 * 8 + lVar38 + -8);
                    dVar18 = *(double *)((long)local_370.p + lVar65 * 8 + lVar37 + -8);
                    dVar19 = *(double *)((long)local_370.p + lVar65 * 8 + lVar54 + lVar56);
                    dVar20 = *(double *)((long)local_370.p + lVar65 * 8 + lVar54 + lVar71);
                    dVar21 = *(double *)((long)local_370.p + lVar65 * 8 + lVar72 + lVar56);
                    dVar22 = *(double *)((long)local_370.p + lVar65 * 8 + lVar72 + lVar71);
                    dVar23 = *(double *)((long)local_370.p + lVar65 * 8 + lVar54 + lVar55);
                    dVar24 = *(double *)((long)local_370.p + lVar65 * 8 + lVar54 + lVar51);
                    dVar25 = *(double *)((long)local_370.p + lVar65 * 8 + lVar72 + lVar55);
                    dVar26 = *(double *)((long)local_370.p + lVar65 * 8 + lVar72 + lVar51);
                    dVar27 = *(double *)((long)local_370.p + lVar65 * 8 + lVar54 + lVar73);
                    dVar28 = *(double *)((long)local_370.p + lVar65 * 8 + lVar54 + lVar46);
                    dVar29 = *(double *)((long)local_370.p + lVar65 * 8 + lVar72 + lVar73);
                    dVar30 = *(double *)((long)local_370.p + lVar65 * 8 + lVar72 + lVar46);
                    dVar31 = *(double *)((long)local_370.p + lVar65 * 8 + lVar36 + -8);
                    dVar32 = *(double *)((long)local_370.p + lVar65 * 8 + lVar76 + -8);
                    dVar33 = *(double *)((long)local_370.p + lVar65 * 8 + lVar74 + -8);
                    *(double *)
                     ((long)local_3b0 +
                     lVar65 * 8 + (lVar77 * lVar67 * 8 + local_2a0 * -8 + lVar58 * 8) * lVar75) =
                         (((*(double *)((long)local_370.p + lVar65 * 8 + lVar78) +
                           *(double *)((long)local_370.p + lVar65 * 8 + lVar36)) - *pdVar1) -
                         *pdVar2) * local_2d0;
                    *(double *)
                     ((long)local_3b0 +
                     lVar65 * 8 +
                     ((lVar70 * 8 + lVar41 + local_2a8 * -8) * lVar67 + local_2a0 * -8 + lVar58 * 8)
                     * lVar75) = (((dVar8 + dVar9) - dVar10) - dVar14) * local_2d0;
                    *(double *)
                     ((long)local_3b0 +
                     lVar65 * 8 +
                     ((lVar70 * 0x10 + lVar66 + local_2a8 * -8) * lVar67 + local_2a0 * -8 +
                     lVar58 * 8) * lVar75) = (((dVar11 + dVar12) - dVar13) - dVar15) * local_2d0;
                    *(double *)
                     ((long)local_3b0 +
                     lVar65 * 8 +
                     ((lVar69 + lVar70 * 0x18 + local_2a8 * -8) * lVar67 + local_2a0 * -8 +
                     lVar58 * 8) * lVar75) = (((dVar19 + dVar20) - dVar21) - dVar22) * local_2d8;
                    *(double *)
                     ((long)local_3b0 +
                     lVar65 * 8 +
                     ((lVar70 * 0x20 + lVar45 + local_2a8 * -8) * lVar67 + local_2a0 * -8 +
                     lVar58 * 8) * lVar75) = (((dVar23 + dVar24) - dVar25) - dVar26) * local_2d8;
                    *(double *)
                     ((long)local_3b0 +
                     lVar65 * 8 +
                     ((lVar69 + lVar70 * 0x28 + local_2a8 * -8) * lVar67 + local_2a0 * -8 +
                     lVar58 * 8) * lVar75) = (((dVar27 + dVar28) - dVar29) - dVar30) * local_2d8;
                    *(double *)
                     ((long)local_3b0 +
                     lVar65 * 8 +
                     ((lVar70 * 0x30 + lVar57 + local_2a8 * -8) * lVar67 + local_2a0 * -8 +
                     lVar58 * 8) * lVar75) = (dVar16 - dVar31) * dVar5;
                    *(double *)
                     ((long)local_3b0 +
                     lVar65 * 8 +
                     ((lVar70 * 0x38 + lVar60 + local_2a8 * -8) * lVar67 + local_2a0 * -8 +
                     lVar58 * 8) * lVar75) = (dVar17 - dVar32) * dVar5;
                    *(double *)
                     ((long)local_3b0 +
                     lVar65 * 8 +
                     ((lVar70 * 0x40 + lVar62 + local_2a8 * -8) * lVar67 + local_2a0 * -8 +
                     lVar58 * 8) * lVar75) = (dVar18 - dVar33) * dVar5;
                    lVar65 = lVar65 + 1;
                  } while ((local_318.bigend.vect[0] - local_318.smallend.vect[0]) + 1 !=
                           (int)lVar65);
                }
                lVar58 = lVar58 + 1;
              } while (iVar50 + 1 != local_318.bigend.vect[1] + 1);
            }
            local_5b0 = local_5b0 + 1;
            iVar40 = iVar40 + 1;
            local_3b0 = local_3b0 + lVar67 * lVar75;
          } while (local_318.bigend.vect[2] + 1 != (int)local_5b0);
        }
        lVar41 = 0;
        do {
          MFIter::nodaltilebox(&local_248,&local_138,(int)lVar41);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_d8,&local_250->_M_elems[lVar41]->super_FabArray<amrex::FArrayBox>,
                     &local_138);
          iVar40 = (&local_210)[lVar41].domain.smallend.vect[0];
          iVar50 = (&local_210)[lVar41].domain.smallend.vect[1];
          iVar34 = (&local_210)[lVar41].domain.smallend.vect[2];
          iVar35 = (&local_1c8)[lVar41 + -1].super_BaseFab<double>.domain.bigend.vect[2];
          lVar66 = (long)(((&local_210)[lVar41].domain.bigend.vect[0] - iVar40) + 1);
          lVar57 = (long)(((&local_1c8)[lVar41 + -1].super_BaseFab<double>.domain.bigend.vect[1] -
                          iVar50) + 1);
          lVar45 = (long)local_248.smallend.vect[1];
          lVar60 = (lVar45 * 8 + ((long)local_248.smallend.vect[2] - (long)iVar34) * lVar57 * 8 +
                   (long)iVar50 * -8) * lVar66 + (long)local_248.smallend.vect[0] * 8 +
                   (long)iVar40 * -8 + (long)(&local_210)[lVar41].dptr;
          lVar62 = lVar57 * lVar66 * 8;
          local_5c0 = 0;
          lVar57 = 0;
          do {
            lVar69 = lVar60;
            lVar70 = (long)local_248.smallend.vect[2];
            if (local_248.smallend.vect[2] <= local_248.bigend.vect[2]) {
              do {
                if (local_248.smallend.vect[1] <= local_248.bigend.vect[1]) {
                  lVar67 = (long)local_d8.p +
                           local_d8.nstride * local_5c0 +
                           (lVar45 - local_d8.begin.y) * local_d8.jstride * 8 +
                           (lVar70 - local_d8.begin.z) * local_d8.kstride * 8 +
                           (long)local_d8.begin.x * -8 + (long)local_248.smallend.vect[0] * 8;
                  lVar63 = lVar45;
                  lVar75 = lVar69;
                  do {
                    if (local_248.smallend.vect[0] <= local_248.bigend.vect[0]) {
                      lVar77 = 0;
                      do {
                        *(undefined8 *)(lVar67 + lVar77 * 8) = *(undefined8 *)(lVar75 + lVar77 * 8);
                        lVar77 = lVar77 + 1;
                      } while ((local_248.bigend.vect[0] - local_248.smallend.vect[0]) + 1 !=
                               (int)lVar77);
                    }
                    lVar63 = lVar63 + 1;
                    lVar67 = lVar67 + local_d8.jstride * 8;
                    lVar75 = lVar75 + lVar66 * 8;
                  } while (local_248.bigend.vect[1] + 1 != (int)lVar63);
                }
                lVar70 = lVar70 + 1;
                lVar69 = lVar69 + lVar62;
              } while (local_248.bigend.vect[2] + 1 != (int)lVar70);
            }
            lVar57 = lVar57 + 1;
            local_5c0 = local_5c0 + 8;
            lVar60 = lVar60 + ((iVar35 - iVar34) + 1) * lVar62;
          } while (lVar57 != 9);
          lVar41 = lVar41 + 1;
        } while (lVar41 != 3);
        Gpu::Elixir::~Elixir(&local_98);
        Gpu::Elixir::~Elixir(&local_80);
        Gpu::Elixir::~Elixir(&local_68);
        pFVar42 = local_2c8;
      }
      else {
        piVar43 = &local_138.currentIndex;
        if (local_138.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar43 = ((local_138.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_138.currentIndex;
        }
        FVar39 = EBCellFlagFab::getType
                           ((pFVar42->m_fabs_v).
                            super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[*piVar43],&local_4c);
        if (FVar39 != covered) {
          if (FVar39 == regular) goto LAB_00701561;
          Abort_host("compVelGrad not yet implemented for cut-cells  ");
        }
      }
      MFIter::operator++(&local_138);
    } while (local_138.currentIndex < local_138.endIndex);
  }
  MFIter::~MFIter(&local_138);
  lVar41 = 0x90;
  do {
    this_00 = (BaseFab<double> *)((long)(&local_210.domain.smallend + -2) + lVar41);
    this_00->_vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
    BaseFab<double>::clear(this_00);
    lVar41 = lVar41 + -0x48;
  } while (lVar41 != -0x48);
  return;
}

Assistant:

void
MLEBTensorOp::compVelGrad (int amrlev, const Array<MultiFab*,AMREX_SPACEDIM>& fluxes,
                       MultiFab& sol, Location loc) const
{
    BL_PROFILE("MLEBTensorOp::compVelGrad()");

    if ( !(loc==Location::FaceCenter || loc==Location::FaceCentroid) )
      amrex::Abort("MLEBTensorOp::compVelGrad() unknown location for VelGradients.");

    const int mglev = 0;

    applyBCTensor(amrlev, mglev, sol, BCMode::Inhomogeneous, StateMode::Solution, m_bndry_sol[amrlev].get());

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    const Geometry& geom = m_geom[amrlev][mglev];
    const auto dxinv = geom.InvCellSizeArray();

    const int dim_fluxes = AMREX_SPACEDIM*AMREX_SPACEDIM;

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
  {
    Array<FArrayBox,AMREX_SPACEDIM> fluxfab_tmp;
    for (MFIter mfi(sol, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (fabtyp == FabType::covered) continue;

        if (fabtyp == FabType::regular)
        {

            Array4<Real const> const vfab = sol.const_array(mfi);
            AMREX_D_TERM(Box const xbx = mfi.nodaltilebox(0);,
                         Box const ybx = mfi.nodaltilebox(1);,
                         Box const zbx = mfi.nodaltilebox(2););
            AMREX_D_TERM(fluxfab_tmp[0].resize(xbx,dim_fluxes);,
                         fluxfab_tmp[1].resize(ybx,dim_fluxes);,
                         fluxfab_tmp[2].resize(zbx,dim_fluxes););
            AMREX_D_TERM(Elixir fxeli = fluxfab_tmp[0].elixir();,
                         Elixir fyeli = fluxfab_tmp[1].elixir();,
                         Elixir fzeli = fluxfab_tmp[2].elixir(););
            AMREX_D_TERM(Array4<Real> const fxfab = fluxfab_tmp[0].array();,
                         Array4<Real> const fyfab = fluxfab_tmp[1].array();,
                         Array4<Real> const fzfab = fluxfab_tmp[2].array(););
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
            ( xbx, txbx,
              {
                  mltensor_vel_grads_fx(txbx,fxfab,vfab,dxinv);
              }
            , ybx, tybx,
              {
                  mltensor_vel_grads_fy(tybx,fyfab,vfab,dxinv);
              }
            , zbx, tzbx,
              {
                  mltensor_vel_grads_fz(tzbx,fzfab,vfab,dxinv);
              }
            );

// The derivatives are put in the array with the following order:
// component: 0    ,  1    ,  2    ,  3    ,  4    , 5    ,  6    ,  7    ,  8
// in 2D:     dU/dx,  dV/dx,  dU/dy,  dV/dy
// in 3D:     dU/dx,  dV/dx,  dW/dx,  dU/dy,  dV/dy, dW/dy,  dU/dz,  dV/dz,  dW/dz


            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                const Box& nbx = mfi.nodaltilebox(idim);
                Array4<Real      > dst = fluxes[idim]->array(mfi);
                Array4<Real const> src = fluxfab_tmp[idim].const_array();
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D (nbx, dim_fluxes, i, j, k, n,
                {
                    dst(i,j,k,n) = src(i,j,k,n);
                });
            }


        }
        else if ( loc==Location::FaceCenter )
        {

          amrex::Abort("compVelGrad not yet implemented for cut-cells  ");

        }
        else // loc==Location::FaceCentroid
        {

          amrex::Abort("compVelGrad not yet implemented for cut-cells  ");

        }

    }
  }
}